

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O1

int ON_SubDSectorType::Compare(ON_SubDSectorType *a,ON_SubDSectorType *b)

{
  ON_SubDVertexTag OVar1;
  ON_SubDVertexTag OVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = 0;
  if (a != b) {
    if (a == (ON_SubDSectorType *)0x0) {
      return -1;
    }
    if (b == (ON_SubDSectorType *)0x0) {
      return 1;
    }
    OVar1 = a->m_vertex_tag;
    OVar2 = b->m_vertex_tag;
    uVar6 = (uint)(OVar2 < OVar1);
    uVar5 = 0xffffffff;
    if (OVar1 < OVar2) {
      uVar6 = 0xffffffff;
    }
    if (uVar6 == 0) {
      uVar3 = a->m_sector_face_count;
      uVar4 = b->m_sector_face_count;
      uVar6 = (uint)(uVar4 < uVar3);
      if (uVar3 < uVar4) {
        uVar6 = 0xffffffff;
      }
      if (uVar6 == 0) {
        uVar5 = 0;
        if (OVar1 == Corner) {
          uVar5 = 0xffffffff;
          if (b->m_corner_sector_angle_index <= a->m_corner_sector_angle_index) {
            uVar5 = (uint)(b->m_corner_sector_angle_index < a->m_corner_sector_angle_index);
          }
        }
      }
      else if (uVar4 != 0) {
        bVar7 = uVar3 == 0;
        goto LAB_0063895a;
      }
    }
    else if (OVar2 != Unset) {
      bVar7 = OVar1 == Unset;
LAB_0063895a:
      if (bVar7) {
        uVar6 = 1;
      }
      return uVar6;
    }
  }
  return uVar5;
}

Assistant:

int ON_SubDSectorType::Compare(const ON_SubDSectorType* a, const ON_SubDSectorType* b)
{
  if ( a == b )
    return 0;
  if (nullptr == a)
    return -1;
  if (nullptr == b)
    return 1;
  
  int rc = 0;
  for (;;)
  {
    rc = CompareUnsigned((unsigned int)a->m_vertex_tag,(unsigned int)b->m_vertex_tag);
    if (0 != rc)
    {
      // bias towards valid tags
      if ( ON_SubDVertexTag::Unset == b->m_vertex_tag)
        rc = -1;
      else if ( ON_SubDVertexTag::Unset == a->m_vertex_tag)
        rc = 1;
      break;
    }
    rc = CompareUnsigned(a->m_sector_face_count,b->m_sector_face_count);
    if (0 != rc)
    {
      // bias towards valid m_sector_face_count bug small
      if ( 0 == b->m_sector_face_count)
        rc = -1;
      else if ( 0 == a->m_sector_face_count)
        rc = 1;
      break;
    }
    if (ON_SubDVertexTag::Corner == a->m_vertex_tag)
    {
      rc = CompareUnsigned(a->m_corner_sector_angle_index, b->m_corner_sector_angle_index);
      if (0 != rc)
        break;
    }

    return 0; // equal
  }

  return rc; // not equal
}